

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::parse_rules_word(Parser *this)

{
  anon_class_16_2_f2d1c13f_for__M_pred __pred;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  FileSection p_new_file_section;
  RulesTokenType RVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_828;
  string local_618;
  Token<ParsedGame::RulesTokenType> local_5f8;
  allocator<char> local_5c1;
  string local_5c0;
  Token<ParsedGame::RulesTokenType> local_5a0;
  string local_570;
  RulesTokenType local_54c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
  local_548;
  string local_518;
  _Optional_payload_base<ParsedGame::RulesTokenType> local_4f4;
  RulesTokenType local_4ec;
  iterator iStack_4e8;
  RulesTokenType token_type;
  ci_equal *local_4e0;
  string *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  found_reserved_word;
  allocator<char> local_4b0;
  allocator<char> local_4af;
  allocator<char> local_4ae;
  allocator<char> local_4ad;
  allocator<char> local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  allocator<char> local_4a8;
  allocator<char> local_4a7;
  allocator<char> local_4a6;
  allocator<char> local_4a5;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_words;
  undefined1 local_a0 [3];
  ci_equal comp_equal;
  string local_60;
  _Optional_payload_base<FileSection> local_3c;
  FileSection local_34;
  undefined1 local_30 [4];
  FileSection fs;
  string parsed_word;
  Parser *this_local;
  
  parsed_word.field_2._8_8_ = this;
  parse_word_abi_cxx11_((string *)local_30,this);
  std::__cxx11::string::string((string *)&local_60,(string *)local_30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
         *)local_a0,&to_file_section_abi_cxx11_);
  local_3c = (_Optional_payload_base<FileSection>)
             str_to_enum<FileSection>
                       (&local_60,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
                         *)local_a0);
  reserved_words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  p_new_file_section =
       std::optional<FileSection>::value_or<FileSection>
                 ((optional<FileSection> *)&local_3c,
                  (FileSection *)
                  ((long)&reserved_words.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
          *)local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  local_34 = p_new_file_section;
  if (p_new_file_section == None) {
    found_reserved_word._M_current._1_1_ = 1;
    local_498 = &local_490;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"NO",&local_499);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_470,"LATE",&local_49a);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_450,"AGAIN",&local_49b);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_430,"MOVING",&local_49c);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_410,"STATIONARY",&local_49d);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3f0,"PARALLEL",&local_49e);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3d0,"PERPENDICULAR",&local_49f);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3b0,"HORIZONTAL",&local_4a0);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_390,"VERTICAL",&local_4a1);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_370,"ORTHOGONAL",&local_4a2);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_350,"ACTION",&local_4a3);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_330,"UP",&local_4a4);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_310,"DOWN",&local_4a5);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2f0,"LEFT",&local_4a6);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2d0,"RIGHT",&local_4a7);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2b0,"CHECKPOINT",&local_4a8);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_290,"CANCEL",&local_4a9);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_270,"WIN",&local_4aa);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_250,"MESSAGE",&local_4ab);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_230,"SFX0",&local_4ac);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_210,"SFX1",&local_4ad);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"SFX2",&local_4ae);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"SFX3",&local_4af);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,"SFX4",&local_4b0);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_190,"SFX5",(allocator<char> *)((long)&found_reserved_word._M_current + 7));
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_170,"SFX6",(allocator<char> *)((long)&found_reserved_word._M_current + 6));
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_150,"SFX7",(allocator<char> *)((long)&found_reserved_word._M_current + 5));
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,"SFX8",(allocator<char> *)((long)&found_reserved_word._M_current + 4));
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_110,"SFX9",(allocator<char> *)((long)&found_reserved_word._M_current + 3));
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"SFX10",(allocator<char> *)((long)&found_reserved_word._M_current + 2));
    found_reserved_word._M_current._1_1_ = 0;
    local_d0 = &local_490;
    local_c8 = 0x1e;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&found_reserved_word);
    __l._M_len = local_c8;
    __l._M_array = local_d0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0,__l,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&found_reserved_word);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&found_reserved_word);
    local_828 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0;
    do {
      local_828 = local_828 + -1;
      std::__cxx11::string::~string((string *)local_828);
    } while (local_828 != &local_490);
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 2))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 3))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 4))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 5))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 6))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&found_reserved_word._M_current + 7))
    ;
    std::allocator<char>::~allocator(&local_4b0);
    std::allocator<char>::~allocator(&local_4af);
    std::allocator<char>::~allocator(&local_4ae);
    std::allocator<char>::~allocator(&local_4ad);
    std::allocator<char>::~allocator(&local_4ac);
    std::allocator<char>::~allocator(&local_4ab);
    std::allocator<char>::~allocator(&local_4aa);
    std::allocator<char>::~allocator(&local_4a9);
    std::allocator<char>::~allocator(&local_4a8);
    std::allocator<char>::~allocator(&local_4a7);
    std::allocator<char>::~allocator(&local_4a6);
    std::allocator<char>::~allocator(&local_4a5);
    std::allocator<char>::~allocator(&local_4a4);
    std::allocator<char>::~allocator(&local_4a3);
    std::allocator<char>::~allocator(&local_4a2);
    std::allocator<char>::~allocator(&local_4a1);
    std::allocator<char>::~allocator(&local_4a0);
    std::allocator<char>::~allocator(&local_49f);
    std::allocator<char>::~allocator(&local_49e);
    std::allocator<char>::~allocator(&local_49d);
    std::allocator<char>::~allocator(&local_49c);
    std::allocator<char>::~allocator(&local_49b);
    std::allocator<char>::~allocator(&local_49a);
    std::allocator<char>::~allocator(&local_499);
    local_4c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0);
    local_4e0 = (ci_equal *)
                ((long)&reserved_words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
    local_4d8 = (string *)local_30;
    __pred.parsed_word = local_4d8;
    __pred.comp_equal = local_4e0;
    local_4c0 = std::
                find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Parser::parse_rules_word()::__0>
                          (local_4c8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_4d0,__pred);
    iStack_4e8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c0);
    bVar1 = __gnu_cxx::operator!=(&local_4c0,&stack0xfffffffffffffb18);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_518,(string *)local_30);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
      ::map(&local_548,&ParsedGame::to_rules_token_type_abi_cxx11_);
      local_4f4 = (_Optional_payload_base<ParsedGame::RulesTokenType>)
                  str_to_enum<ParsedGame::RulesTokenType>(&local_518,&local_548);
      local_54c = None;
      RVar2 = std::optional<ParsedGame::RulesTokenType>::value_or<ParsedGame::RulesTokenType>
                        ((optional<ParsedGame::RulesTokenType> *)&local_4f4,&local_54c);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
      ::~map(&local_548);
      std::__cxx11::string::~string((string *)&local_518);
      local_4ec = RVar2;
      if (RVar2 == None) {
        std::__cxx11::string::string((string *)&local_570,(string *)local_30);
        detect_error(this,&local_570);
        std::__cxx11::string::~string((string *)&local_570);
      }
      RVar2 = local_4ec;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"",&local_5c1);
      Token<ParsedGame::RulesTokenType>::Token(&local_5a0,RVar2,&local_5c0,this->m_line_counter);
      std::
      vector<Token<ParsedGame::RulesTokenType>,_std::allocator<Token<ParsedGame::RulesTokenType>_>_>
      ::push_back(&(this->m_parsed_game).rules_tokens,&local_5a0);
      Token<ParsedGame::RulesTokenType>::~Token(&local_5a0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
    }
    else {
      std::__cxx11::string::string((string *)&local_618,(string *)local_30);
      Token<ParsedGame::RulesTokenType>::Token
                (&local_5f8,Identifier,&local_618,this->m_line_counter);
      std::
      vector<Token<ParsedGame::RulesTokenType>,_std::allocator<Token<ParsedGame::RulesTokenType>_>_>
      ::push_back(&(this->m_parsed_game).rules_tokens,&local_5f8);
      Token<ParsedGame::RulesTokenType>::~Token(&local_5f8);
      std::__cxx11::string::~string((string *)&local_618);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
  }
  else {
    try_change_file_section(this,p_new_file_section);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Parser::parse_rules_word()
{
	string parsed_word = parse_word();

	FileSection fs = str_to_enum(parsed_word, to_file_section).value_or(FileSection::None);

	if(fs != FileSection::None)
	{
		try_change_file_section(fs);
	}
	else
	{
		ci_equal comp_equal;

		vector<string> reserved_words = {
			"NO",
			"LATE",
			"AGAIN",
			"MOVING",
			"STATIONARY",
        	"PARALLEL",
        	"PERPENDICULAR",
        	"HORIZONTAL",
        	"VERTICAL",
			"ORTHOGONAL",
			"ACTION",
			"UP",
			"DOWN",
			"LEFT",
			"RIGHT",
			"CHECKPOINT",
			"CANCEL",
			"WIN",
			"MESSAGE",
			"SFX0", "SFX1","SFX2","SFX3","SFX4","SFX5","SFX6","SFX7","SFX8","SFX9","SFX10"};

		auto found_reserved_word = std::find_if(reserved_words.begin(),reserved_words.end(),[&](const string& s){
			return comp_equal(s, parsed_word);
		});

		if(found_reserved_word != reserved_words.end())
		{
			ParsedGame::RulesTokenType token_type = str_to_enum(parsed_word,ParsedGame::to_rules_token_type).value_or(ParsedGame::RulesTokenType::None);
			if(token_type == ParsedGame::RulesTokenType::None)
			{
				//todo more explicit error message
				detect_error(parsed_word);
			}

			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(token_type,"",m_line_counter));
		}
		else
		{
			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(ParsedGame::RulesTokenType::Identifier,parsed_word,m_line_counter));
		}
	}
}